

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  pointer ppeVar5;
  example *ec;
  int *piVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  double dVar8;
  v_array<char> vVar9;
  bool bVar10;
  char cVar11;
  ostream *poVar12;
  float *pfVar13;
  pointer ppeVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  string outputString;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffdc8 [11];
  char in_stack_fffffffffffffdd3;
  float in_stack_fffffffffffffdd4;
  vw *pvVar19;
  multi_ex *pmVar20;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar3 = (head_ec->l).cs.costs._begin;
  pwVar4 = (head_ec->l).cs.costs._end;
  if ((((head_ec->tag)._end != (head_ec->tag)._begin) ||
      ((head_ec->super_example_predict).indices._end !=
       (head_ec->super_example_predict).indices._begin)) &&
     (bVar10 = ec_is_label_definition(head_ec), !bVar10)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + head_ec->num_features;
    cVar11 = (*(code *)PTR_test_label_002f2ad0)();
    if (cVar11 == '\0') {
      ppeVar14 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar14 == ppeVar5) {
        dVar8 = 0.0;
      }
      else {
        in_stack_fffffffffffffdd4 = 0.0;
        uVar17 = 0;
        do {
          ec = *ppeVar14;
          bVar10 = COST_SENSITIVE::ec_is_example_header(ec);
          if (!bVar10) {
            if (*hit_loss != false) break;
            if (uVar17 == ((head_ec->pred).a_s._begin)->action) {
              in_stack_fffffffffffffdd4 = ((ec->l).cs.costs._begin)->x;
              *hit_loss = true;
            }
            uVar17 = uVar17 + 1;
          }
          ppeVar14 = ppeVar14 + 1;
        } while (ppeVar14 != ppeVar5);
        dVar8 = (double)in_stack_fffffffffffffdd4;
      }
      all->sd->sum_loss = all->sd->sum_loss + dVar8;
      all->sd->sum_loss_since_last_dump = dVar8 + all->sd->sum_loss_since_last_dump;
    }
    piVar6 = (all->final_prediction_sink)._end;
    pmVar20 = ec_seq;
    for (piVar15 = (all->final_prediction_sink)._begin; piVar15 != piVar6; piVar15 = piVar15 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar15,(v_array<ACTION_SCORE::action_score> *)&(head_ec->pred).scalars,
                 &head_ec->tag);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar18 = (long)pwVar4 - (long)pwVar3;
      ec_seq = pmVar20;
      if (lVar18 != 0) {
        lVar18 = lVar18 >> 4;
        pfVar13 = &pwVar3->partial_prediction;
        lVar16 = 0;
        do {
          if (lVar16 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdd3,1);
          }
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdd3 = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,&stack0xfffffffffffffdd3,1);
          std::ostream::_M_insert<double>((double)*pfVar13);
          lVar16 = lVar16 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar16);
      }
      p_Var7 = all->print_text;
      iVar2 = all->raw_prediction;
      pvVar19 = all;
      std::__cxx11::stringbuf::str();
      vVar9._end._3_1_ = in_stack_fffffffffffffdd3;
      vVar9._0_11_ = in_stack_fffffffffffffdc8;
      vVar9._end._4_4_ = in_stack_fffffffffffffdd4;
      vVar9.end_array = (char *)pvVar19;
      vVar9.erase_count = (size_t)ec_seq;
      (*p_Var7)(iVar2,(string)head_ec->tag,vVar9);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar10 = (bool)(*(code *)PTR_test_label_002f2ad0)(&head_ec->l);
    COST_SENSITIVE::print_update(all,bVar10,head_ec,ec_seq,true,0);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (ec_is_example_header(*ex))
        continue;
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}